

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpClient.cpp
# Opt level: O0

Log * __thiscall HttpClient::GetFullLog(Log *__return_storage_ptr__,HttpClient *this)

{
  HttpClient *this_local;
  
  Log::Log(__return_storage_ptr__,&this->_log);
  return __return_storage_ptr__;
}

Assistant:

Log HttpClient::GetFullLog() {
  return _log;
}